

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O3

DTLSReadEpoch * bssl::dtls_get_read_epoch(SSL *ssl,uint16_t epoch)

{
  DTLS1_STATE *pDVar1;
  DTLSPrevReadEpoch *pDVar2;
  DTLSPrevReadEpoch *pDVar3;
  
  pDVar1 = ssl->d1;
  if ((pDVar1->read_epoch).epoch == epoch) {
    return &pDVar1->read_epoch;
  }
  pDVar3 = (DTLSPrevReadEpoch *)
           (pDVar1->next_read_epoch)._M_t.
           super___uniq_ptr_impl<bssl::DTLSReadEpoch,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::DTLSReadEpoch_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::DTLSReadEpoch_*,_false>._M_head_impl;
  if ((pDVar3 == (DTLSPrevReadEpoch *)0x0) || ((pDVar3->epoch).epoch != epoch)) {
    pDVar2 = (pDVar1->prev_read_epoch)._M_t.
             super___uniq_ptr_impl<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_bssl::DTLSPrevReadEpoch_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::DTLSPrevReadEpoch_*,_false>._M_head_impl;
    pDVar3 = (DTLSPrevReadEpoch *)0x0;
    if ((pDVar2 != (DTLSPrevReadEpoch *)0x0) && ((pDVar2->epoch).epoch == epoch)) {
      pDVar3 = pDVar2;
    }
  }
  return &pDVar3->epoch;
}

Assistant:

DTLSReadEpoch *dtls_get_read_epoch(const SSL *ssl, uint16_t epoch) {
  if (epoch == ssl->d1->read_epoch.epoch) {
    return &ssl->d1->read_epoch;
  }
  if (ssl->d1->next_read_epoch != nullptr &&
      epoch == ssl->d1->next_read_epoch->epoch) {
    return ssl->d1->next_read_epoch.get();
  }
  if (ssl->d1->prev_read_epoch != nullptr &&
      epoch == ssl->d1->prev_read_epoch->epoch.epoch) {
    return &ssl->d1->prev_read_epoch->epoch;
  }
  return nullptr;
}